

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

uint64_t AArch64_AM_decodeAdvSIMDModImmType10(uint8_t Imm)

{
  undefined8 local_18;
  uint64_t EncVal;
  uint8_t Imm_local;
  
  local_18 = 0;
  if ((Imm & 0x80) != 0) {
    local_18 = 0xff00000000000000;
  }
  if ((Imm & 0x40) != 0) {
    local_18 = local_18 | 0xff000000000000;
  }
  if ((Imm & 0x20) != 0) {
    local_18 = local_18 | 0xff0000000000;
  }
  if ((Imm & 0x10) != 0) {
    local_18 = local_18 | 0xff00000000;
  }
  if ((Imm & 8) != 0) {
    local_18 = local_18 | 0xff000000;
  }
  if ((Imm & 4) != 0) {
    local_18 = local_18 | 0xff0000;
  }
  if ((Imm & 2) != 0) {
    local_18 = local_18 | 0xff00;
  }
  if ((Imm & 1) != 0) {
    local_18 = local_18 | 0xff;
  }
  return local_18;
}

Assistant:

static inline uint64_t AArch64_AM_decodeAdvSIMDModImmType10(uint8_t Imm)
{
	uint64_t EncVal = 0;
	if (Imm & 0x80) EncVal |= 0xff00000000000000ULL;
	if (Imm & 0x40) EncVal |= 0x00ff000000000000ULL;
	if (Imm & 0x20) EncVal |= 0x0000ff0000000000ULL;
	if (Imm & 0x10) EncVal |= 0x000000ff00000000ULL;
	if (Imm & 0x08) EncVal |= 0x00000000ff000000ULL;
	if (Imm & 0x04) EncVal |= 0x0000000000ff0000ULL;
	if (Imm & 0x02) EncVal |= 0x000000000000ff00ULL;
	if (Imm & 0x01) EncVal |= 0x00000000000000ffULL;
	return EncVal;
}